

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiAnalyzerSettings.cpp
# Opt level: O2

void __thiscall
EnrichableSpiAnalyzerSettings::UpdateInterfacesFromSettings(EnrichableSpiAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mMosiChannelInterface)._M_ptr);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mMisoChannelInterface)._M_ptr);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mClockChannelInterface)._M_ptr);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mEnableChannelInterface)._M_ptr);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mShiftOrder);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mBitsPerTransfer);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mClockInactiveState);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mDataValidEdge);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mEnableActiveState);
  AnalyzerSettingInterfaceText::SetText((char *)(this->mParserCommandInterface)._M_ptr);
  return;
}

Assistant:

void EnrichableSpiAnalyzerSettings::UpdateInterfacesFromSettings()
{
	mMosiChannelInterface->SetChannel( mMosiChannel );
	mMisoChannelInterface->SetChannel( mMisoChannel );
	mClockChannelInterface->SetChannel( mClockChannel );
	mEnableChannelInterface->SetChannel( mEnableChannel );
	mShiftOrderInterface->SetNumber( mShiftOrder );
	mBitsPerTransferInterface->SetNumber( mBitsPerTransfer );
	mClockInactiveStateInterface->SetNumber( mClockInactiveState );
	mDataValidEdgeInterface->SetNumber( mDataValidEdge );
	mEnableActiveStateInterface->SetNumber( mEnableActiveState );
	mParserCommandInterface->SetText( mParserCommand );
}